

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler>
::char_spec_handler::on_int(char_spec_handler *this)

{
  ulong uVar1;
  char value;
  arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler> *this_00;
  buffer<char> *pbVar2;
  size_t sVar3;
  
  this_00 = this->formatter;
  value = this->value;
  if (this_00->specs_ != (basic_format_specs<char> *)0x0) {
    basic_writer<fmt::v6::buffer_range<char>>::write_int<char,fmt::v6::basic_format_specs<char>>
              ((basic_writer<fmt::v6::buffer_range<char>> *)this_00,value,this_00->specs_);
    return;
  }
  pbVar2 = (this_00->writer_).out_.container;
  sVar3 = pbVar2->size_;
  uVar1 = sVar3 + 1;
  if (pbVar2->capacity_ < uVar1) {
    (**pbVar2->_vptr_buffer)(pbVar2,uVar1);
  }
  pbVar2->size_ = uVar1;
  pbVar2->ptr_[sVar3] = value;
  return;
}

Assistant:

void on_int() {
      if (formatter.specs_)
        formatter.writer_.write_int(value, *formatter.specs_);
      else
        formatter.writer_.write(value);
    }